

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

void __thiscall QPixmap::QPixmap(QPixmap *this,QPixmap *pixmap)

{
  bool bVar1;
  QPixmap *in_RSI;
  QPaintDevice *in_RDI;
  long in_FS_OFFSET;
  QPixmap *in_stack_ffffffffffffffa8;
  QExplicitlySharedDataPointer<QPlatformPixmap> *in_stack_ffffffffffffffb0;
  EVP_PKEY_CTX local_30 [16];
  QPixmap local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(in_RDI);
  in_RDI->_vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_00e14ce8;
  QExplicitlySharedDataPointer<QPlatformPixmap>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x3208db);
  bVar1 = qt_pixmap_thread_test();
  if (bVar1) {
    bVar1 = QPaintDevice::paintingActive(&in_RSI->super_QPaintDevice);
    if (bVar1) {
      QRect::QRect((QRect *)in_RSI);
      copy(&local_20,(EVP_PKEY_CTX *)in_RSI,local_30);
      swap(in_RSI,in_stack_ffffffffffffffa8);
      ~QPixmap(in_RSI);
    }
    else {
      QExplicitlySharedDataPointer<QPlatformPixmap>::operator=
                (in_stack_ffffffffffffffb0,
                 (QExplicitlySharedDataPointer<QPlatformPixmap> *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    doInit(in_RSI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap::QPixmap(const QPixmap &pixmap)
    : QPaintDevice()
{
    if (!qt_pixmap_thread_test()) {
        doInit(0, 0, QPlatformPixmap::PixmapType);
        return;
    }
    if (pixmap.paintingActive()) {                // make a deep copy
        pixmap.copy().swap(*this);
    } else {
        data = pixmap.data;
    }
}